

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  
  buffer_suite::run();
  basic_suite::run();
  integer_suite::run();
  number_suite::run();
  string_suite::run();
  container_suite::run();
  literal_suite::test_string();
  literal_suite::test_quote();
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    buffer_suite::run();
    basic_suite::run();
    integer_suite::run();
    number_suite::run();
    string_suite::run();
    container_suite::run();
    literal_suite::run();

    return boost::report_errors();
}